

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::strengthenInequalities
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt *num_strengthened)

{
  pointer pdVar1;
  pointer pdVar2;
  iterator __position;
  Result RVar3;
  HighsLp *pHVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  pointer piVar12;
  HighsInt row;
  ulong uVar13;
  iterator __begin3;
  long lVar14;
  long lVar15;
  pointer piVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double val;
  double dVar22;
  int8_t comp;
  HighsInt pos;
  vector<double,_std::allocator<double>_> reducedcost;
  vector<int,_std::allocator<int>_> indices;
  double ub;
  double weight;
  vector<int,_std::allocator<int>_> stack;
  vector<int,_std::allocator<int>_> positions;
  vector<int,_std::allocator<int>_> cover;
  vector<double,_std::allocator<double>_> upper;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> coefs;
  char local_22d;
  int local_22c;
  vector<double,_std::allocator<double>_> local_228;
  double local_210;
  vector<int,_std::allocator<int>_> local_208;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  HighsCDouble local_1c8;
  double local_1b8;
  undefined8 uStack_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  vector<int,_std::allocator<int>_> local_188;
  double local_168;
  undefined4 uStack_160;
  uint uStack_15c;
  double local_158;
  undefined8 uStack_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<double,_std::allocator<double>_> local_128;
  double local_110;
  vector<signed_char,_std::allocator<signed_char>_> local_108;
  double local_e8;
  int local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  int *local_98;
  HighsPostsolveStack *local_90;
  ulong local_88;
  HPresolve *local_80;
  ulong local_78;
  pointer local_70;
  HighsOptions *local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  
  local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (char *)0x0;
  local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (char *)0x0;
  uVar10 = 0;
  local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  *num_strengthened = 0;
  pHVar4 = this->model;
  local_98 = num_strengthened;
  local_90 = postsolve_stack;
  if (pHVar4->num_row_ != 0) {
    uVar13 = 0;
    do {
      iVar7 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      if (1 < (long)iVar7) {
        local_1b8 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar13];
        uStack_1b0 = 0;
        if ((local_1b8 <= -INFINITY) ||
           (INFINITY <=
            (pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13])) {
          iVar11 = (pHVar4->num_col_ - this->numDeletedCols) / 0x14;
          if (iVar11 < 0x3e9) {
            iVar11 = 1000;
          }
          if (iVar11 < iVar7) {
LAB_0031da9a:
            bVar6 = 0;
          }
          else {
            local_e8 = -1.0;
            if (local_1b8 <= -INFINITY) {
              local_1b8 = -(pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar13];
              uStack_1b0 = 0x8000000000000000;
              local_e8 = 1.0;
            }
            if (local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<signed_char,_std::allocator<signed_char>_>::reserve(&local_108,(long)iVar7);
            std::vector<double,_std::allocator<double>_>::reserve
                      (&local_228,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
            std::vector<double,_std::allocator<double>_>::reserve
                      (&local_128,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_208,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_188,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_1a8,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar13]);
            piVar8 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar13;
            if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1a8,
                         (iterator)
                         local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,piVar8);
            }
            else {
              *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *piVar8;
              local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_210 = 0.0;
              bVar17 = false;
              local_d8 = 0.0;
              uStack_d0 = 0;
              local_110 = 0.0;
            }
            else {
              local_110 = 0.0;
              local_d8 = 0.0;
              uStack_d0 = 0;
              local_210 = 0.0;
              do {
                __position._M_current =
                     local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
                local_22c = local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish[-1];
                piVar12 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar7 = piVar12[local_22c];
                if (iVar7 != -1) {
                  if (__position._M_current ==
                      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current;
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_1a8,__position,
                               piVar12 + local_22c);
                    __position._M_current =
                         local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                  }
                  else {
                    local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1] = iVar7;
                    __position._M_current =
                         local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                  }
                }
                local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current;
                piVar12 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar7 = piVar12[local_22c];
                if (iVar7 != -1) {
                  if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_1a8,
                               (iterator)
                               local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,piVar12 + local_22c);
                  }
                  else {
                    *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar7;
                    local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                pHVar4 = this->model;
                iVar7 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_22c];
                pdVar1 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                bVar17 = true;
                if (-INFINITY < pdVar1[iVar7]) {
                  bVar17 = INFINITY <=
                           (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar7];
                }
                if (!bVar17) {
                  local_1c8.hi = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[local_22c] * local_e8;
                  pdVar2 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  local_1e0 = pdVar2[iVar7] - pdVar1[iVar7];
                  if (local_1c8.hi <= 0.0) {
                    local_22d = -1;
                    dVar20 = pdVar1[iVar7] * local_1c8.hi;
                    dVar22 = local_1b8 + dVar20;
                    local_1d8 = (local_1b8 - (dVar22 - dVar20)) +
                                (dVar20 - (dVar22 - (dVar22 - dVar20)));
                    local_1c8.hi = -local_1c8.hi;
                    local_1b8 = dVar22;
                  }
                  else {
                    local_22d = '\x01';
                    dVar20 = local_1c8.hi * pdVar2[iVar7];
                    dVar22 = local_1b8 + dVar20;
                    local_1d8 = (local_1b8 - (dVar22 - dVar20)) +
                                (dVar20 - (dVar22 - (dVar22 - dVar20)));
                    local_1b8 = dVar22;
                  }
                  if ((this->primal_feastol < local_1e0) && (this->primal_feastol < local_1c8.hi)) {
                    if ((pHVar4->integrality_).
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7] == kContinuous) {
                      dVar20 = local_1e0 * local_1c8.hi;
                      dVar22 = local_d8 + dVar20;
                      local_110 = local_110 +
                                  (local_d8 - (dVar22 - dVar20)) +
                                  (dVar20 - (dVar22 - (dVar22 - dVar20)));
                      local_d8 = dVar22;
                    }
                    else {
                      local_dc = (int)((ulong)((long)local_228.
                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_228.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                      if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_208,
                                   (iterator)
                                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&local_dc);
                      }
                      else {
                        *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_dc;
                        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)&local_188,
                                   (iterator)
                                   local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&local_22c);
                      }
                      else {
                        *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_22c;
                        local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                  ((vector<double,std::allocator<double>> *)&local_228,
                                   (iterator)
                                   local_228.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_1c8.hi);
                      }
                      else {
                        *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_1c8.hi;
                        local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      if (local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<signed_char,std::allocator<signed_char>>::
                        _M_realloc_insert<signed_char_const&>
                                  ((vector<signed_char,std::allocator<signed_char>> *)&local_108,
                                   (iterator)
                                   local_108.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_22d);
                      }
                      else {
                        *local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish = local_22d;
                        local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                      if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                  ((vector<double,std::allocator<double>> *)&local_128,
                                   (iterator)
                                   local_128.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_1e0);
                      }
                      else {
                        *local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_1e0;
                        local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                    }
                  }
                  local_210 = local_210 + local_1d8;
                }
              } while ((!bVar17) &&
                      (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish));
            }
            if (((uVar13 & 100) == 0) ||
               (iVar11 < (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13] * 10)) {
              RVar3 = checkTimeLimit(this);
              bVar6 = 1;
              uVar10 = uVar10 & 0xffffffff;
              if (RVar3 == kOk) goto LAB_0031e026;
              uVar10 = (ulong)RVar3;
            }
            else {
LAB_0031e026:
              if (bVar17) {
                if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                goto LAB_0031da9a;
              }
              dVar20 = this->primal_feastol;
              if (local_1b8 + local_210 <= dVar20) {
                RVar3 = rowPresolve(this,local_90,(HighsInt)uVar13);
                bVar6 = (RVar3 == kOk) * '\x03' + 1;
                uVar10 = uVar10 & 0xffffffff;
                if (RVar3 != kOk) {
                  uVar10 = (ulong)RVar3;
                }
                goto LAB_0031ee97;
              }
              local_1e8 = (local_1b8 + local_210) * dVar20;
              if (local_1e8 <= dVar20 * 100.0) {
                local_1e8 = dVar20 * 100.0;
              }
              uStack_44 = local_d8._4_4_ ^ 0x80000000;
              uStack_3c = uStack_d0._4_4_ ^ 0x80000000;
              local_48 = (undefined4)local_d8;
              uStack_40 = (undefined4)uStack_d0;
              local_88 = uVar13;
              local_80 = this;
              local_78 = uVar10;
              do {
                local_1d8 = local_1b8 - local_d8;
                local_168 = (((double)CONCAT44(uStack_44,local_48) - (local_1d8 - local_1b8)) +
                             (local_1b8 - (local_1d8 - (local_1d8 - local_1b8))) + local_210) -
                            local_110;
                if ((local_1d8 + local_168 <= local_1e8) ||
                   (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish)) break;
                uVar5 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                iVar7 = 0;
                if (1 < uVar5) {
                  iVar7 = 0;
                  do {
                    uVar5 = (long)uVar5 >> 1;
                    iVar7 = iVar7 + 1;
                  } while (1 < uVar5);
                }
                pdqsort_detail::
                pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_228,iVar7,true);
                if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                std::vector<int,_std::allocator<int>_>::reserve
                          (&local_148,
                           (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2);
                if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != 0) {
                  lVar14 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2;
                  do {
                    iVar7 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14 + -1];
                    local_1c8.hi = (double)CONCAT44(local_1c8.hi._4_4_,iVar7);
                    dVar20 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar7] *
                             local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar7];
                    if (((1000.0 < local_128.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar7]) ||
                        (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar7] <= local_1e8)) ||
                       (dVar22 = local_1d8 - dVar20,
                       local_1e8 <
                       (-dVar20 - (dVar22 - local_1d8)) +
                       (local_1d8 - (dVar22 - (dVar22 - local_1d8))) + local_168 + dVar22)) {
                      dVar22 = local_1d8 - dVar20;
                      local_168 = local_168 +
                                  (local_1d8 - (dVar20 + dVar22)) +
                                  (-dVar20 - (dVar22 - (dVar20 + dVar22)));
                      local_1d8 = dVar22;
                    }
                    else if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish ==
                             local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_148,
                                 (iterator)
                                 local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)&local_1c8);
                    }
                    else {
                      *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = iVar7;
                      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
                if ((local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start ==
                     local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
                   (piVar12 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                   piVar8 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, local_1d8 + local_168 <= local_1e8)) {
                  bVar17 = false;
                }
                else {
                  while (piVar9 = piVar12, piVar8 = piVar8 + 1,
                        piVar8 != local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish) {
                    dVar20 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[*piVar8];
                    if ((dVar20 <= 0.001) ||
                       (dVar22 = local_228.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*piVar9], dVar22 <= 0.001)
                       ) {
                      dVar22 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[*piVar9];
                      bVar17 = dVar20 < local_228.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[*piVar9];
                    }
                    else {
                      bVar17 = dVar22 < dVar20;
                    }
                    piVar12 = piVar8;
                    if (bVar17 || dVar22 == dVar20) {
                      piVar12 = piVar9;
                    }
                  }
                  local_c0 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[*piVar9];
                  local_60 = local_1d8 + local_168;
                  std::vector<double,_std::allocator<double>_>::resize
                            (&local_b8,
                             (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2);
                  local_1c8.hi = local_1d8;
                  local_1c8.lo = local_168;
                  HighsCDouble::operator/=(&local_1c8,local_c0);
                  dVar20 = local_1c8.hi - this->primal_feastol;
                  dVar20 = ceil((-this->primal_feastol - (dVar20 - local_1c8.hi)) +
                                (local_1c8.hi - (dVar20 - (dVar20 - local_1c8.hi))) + local_1c8.lo +
                                dVar20);
                  pdVar2 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  piVar12 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar1 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_58 = 1.0;
                  if (1.0 <= dVar20) {
                    local_58 = dVar20;
                  }
                  uStack_50 = 0;
                  uStack_1d0 = 0x8000000000000000;
                  local_1d8 = -local_58;
                  local_1e0 = INFINITY;
                  lVar14 = (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  if (lVar14 == 0) {
                    local_168 = 0.0;
                  }
                  else {
                    local_68 = this->options;
                    local_70 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                    local_168 = 0.0;
                    lVar15 = 0;
                    do {
                      iVar7 = piVar12[lVar15];
                      uVar18 = SUB84(local_60,0);
                      uVar19 = (undefined4)((ulong)local_60 >> 0x20);
                      dVar20 = pdVar1[iVar7];
                      if (dVar20 <= local_60) {
                        uVar18 = SUB84(dVar20,0);
                        uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
                      }
                      local_158 = local_1d8;
                      dVar20 = ceil((double)CONCAT44(uVar19,uVar18) / local_c0 -
                                    (local_68->super_HighsOptionsStruct).small_matrix_value);
                      local_70[lVar15] = dVar20;
                      dVar22 = pdVar2[iVar7] * dVar20;
                      local_1d8 = local_1d8 + dVar22;
                      local_168 = local_168 +
                                  (local_158 - (local_1d8 - dVar22)) +
                                  (dVar22 - (local_1d8 - (local_1d8 - dVar22)));
                      dVar20 = pdVar1[iVar7] / dVar20;
                      if (local_1e0 <= dVar20) {
                        dVar20 = local_1e0;
                      }
                      lVar15 = lVar15 + 1;
                      local_1e0 = dVar20;
                    } while (lVar14 >> 2 != lVar15);
                  }
                  local_1c8.hi = local_1b8;
                  local_1c8.lo = local_210;
                  HighsCDouble::operator/=(&local_1c8,local_58);
                  uVar10 = local_78;
                  this = local_80;
                  uVar13 = local_88;
                  local_158 = local_1c8.hi + local_1c8.lo;
                  if (local_1e0 <= local_1c8.hi + local_1c8.lo) {
                    local_158 = local_1e0;
                  }
                  local_22c = (int)((ulong)((long)local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_228.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  local_1e0 = local_158;
                  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_228,
                               (iterator)
                               local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,&local_1e0);
                  }
                  else {
                    *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_158;
                    local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_1c8.hi = local_1d8 + local_168;
                  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_128,
                               (iterator)
                               local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,&local_1c8.hi);
                  }
                  else {
                    *local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_1c8.hi;
                    local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  if ((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start != 0) {
                    lVar14 = 0;
                    do {
                      local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]] =
                           local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14]] -
                           local_1e0 *
                           local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14];
                      lVar14 = lVar14 + 1;
                    } while ((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2 != lVar14);
                  }
                  lVar14 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 4;
                  piVar12 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (0 < lVar14) {
                    dVar20 = this->primal_feastol;
                    piVar12 = (pointer)(((long)local_208.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                         (long)local_208.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start &
                                        0xfffffffffffffff0U) +
                                       (long)local_208.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                    lVar14 = lVar14 + 1;
                    piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + 2;
                    do {
                      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[-2]] <= dVar20) {
                        piVar8 = piVar8 + -2;
                        goto LAB_0031e7c9;
                      }
                      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[-1]] <= dVar20) {
                        piVar8 = piVar8 + -1;
                        goto LAB_0031e7c9;
                      }
                      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar8] <= dVar20) goto LAB_0031e7c9;
                      if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[1]] <= dVar20) {
                        piVar8 = piVar8 + 1;
                        goto LAB_0031e7c9;
                      }
                      lVar14 = lVar14 + -1;
                      piVar8 = piVar8 + 4;
                    } while (1 < lVar14);
                  }
                  lVar14 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar12 >> 2;
                  if (lVar14 == 1) {
LAB_0031e796:
                    piVar8 = piVar12;
                    if (this->primal_feastol <
                        local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[*piVar12]) {
                      piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                    }
                  }
                  else {
                    piVar8 = piVar12;
                    if (lVar14 == 2) {
LAB_0031e77c:
                      if (this->primal_feastol <
                          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar8]) {
                        piVar12 = piVar8 + 1;
                        goto LAB_0031e796;
                      }
                    }
                    else {
                      piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                      if ((lVar14 == 3) &&
                         (piVar8 = piVar12,
                         this->primal_feastol <
                         local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar12])) {
                        piVar8 = piVar12 + 1;
                        goto LAB_0031e77c;
                      }
                    }
                  }
LAB_0031e7c9:
                  if ((piVar8 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish) &&
                     (piVar9 = piVar8 + 1,
                     piVar9 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish)) {
                    dVar20 = this->primal_feastol;
                    do {
                      if (dVar20 < local_228.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[*piVar9]) {
                        *piVar8 = *piVar9;
                        piVar8 = piVar8 + 1;
                      }
                      piVar9 = piVar9 + 1;
                    } while (piVar9 != local_208.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish);
                  }
                  if ((piVar8 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish) &&
                     (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish != piVar8)) {
                    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = piVar8;
                  }
                  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_208,
                               (iterator)
                               local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_22c);
                  }
                  else {
                    *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_22c;
                    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  dVar22 = local_58 * local_158;
                  dVar20 = local_1b8 - dVar22;
                  local_210 = local_210 +
                              (local_1b8 - (dVar22 + dVar20)) +
                              (-dVar22 - (dVar20 - (dVar22 + dVar20)));
                  bVar17 = true;
                  local_1b8 = dVar20;
                }
              } while (bVar17);
              dVar20 = local_1b8 + this->primal_feastol;
              dVar20 = (this->primal_feastol - (dVar20 - local_1b8)) +
                       (local_1b8 - (dVar20 - (dVar20 - local_1b8))) + local_210 + dVar20;
              lVar14 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 4;
              piVar12 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (0 < lVar14) {
                uVar5 = (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                piVar12 = (pointer)(((long)local_208.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_208.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start &
                                    0xfffffffffffffff0U) +
                                   (long)local_208.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                lVar14 = lVar14 + 1;
                piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 2;
                do {
                  if ((uVar5 <= (ulong)(long)piVar8[-2]) ||
                     (ABS(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[-2]]) <= dVar20)) {
                    piVar8 = piVar8 + -2;
                    goto LAB_0031eaea;
                  }
                  if ((uVar5 <= (ulong)(long)piVar8[-1]) ||
                     (ABS(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[-1]]) <= dVar20)) {
                    piVar8 = piVar8 + -1;
                    goto LAB_0031eaea;
                  }
                  if ((uVar5 <= (ulong)(long)*piVar8) ||
                     (ABS(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar8]) <= dVar20)) goto LAB_0031eaea;
                  if ((uVar5 <= (ulong)(long)piVar8[1]) ||
                     (ABS(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar8[1]]) <= dVar20)) {
                    piVar8 = piVar8 + 1;
                    goto LAB_0031eaea;
                  }
                  lVar14 = lVar14 + -1;
                  piVar8 = piVar8 + 4;
                } while (1 < lVar14);
              }
              lVar14 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar12 >> 2;
              if (lVar14 == 1) {
LAB_0031ea79:
                piVar8 = piVar12;
                if (((ulong)(long)*piVar12 <
                     (ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2)) &&
                   (dVar20 < ABS(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*piVar12]))) {
                  piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                }
              }
              else if (lVar14 == 2) {
LAB_0031ea41:
                piVar8 = piVar12;
                if (((ulong)(long)*piVar12 <
                     (ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2)) &&
                   (dVar20 < ABS(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*piVar12]))) {
                  piVar12 = piVar12 + 1;
                  goto LAB_0031ea79;
                }
              }
              else {
                piVar8 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((lVar14 == 3) &&
                    (piVar8 = piVar12,
                    (ulong)(long)*piVar12 <
                    (ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2))) &&
                   (dVar20 < ABS(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*piVar12]))) {
                  piVar12 = piVar12 + 1;
                  goto LAB_0031ea41;
                }
              }
LAB_0031eaea:
              if ((piVar8 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish) &&
                 (piVar9 = piVar8 + 1,
                 piVar9 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                do {
                  iVar7 = *piVar9;
                  if (((ulong)(long)iVar7 <
                       (ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 2)) &&
                     (dVar20 < ABS(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar7]))) {
                    *piVar8 = iVar7;
                    piVar8 = piVar8 + 1;
                  }
                  piVar9 = piVar9 + 1;
                } while (piVar9 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
              }
              if ((piVar8 != local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish) &&
                 (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar8)) {
                local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar8;
              }
              piVar12 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) goto LAB_0031da9a;
              uStack_15c = uStack_1b0._4_4_ ^ 0x80000000;
              local_168 = -local_1b8;
              uStack_160 = (undefined4)uStack_1b0;
              row = (HighsInt)uVar13;
              if (0.0 <= local_e8) {
                dVar20 = (this->model->row_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                dVar22 = 0.0;
                piVar16 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar7 = *piVar16;
                  dVar21 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar7] - local_1b8;
                  dVar21 = (((local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar7] - (local_1b8 + dVar21)) +
                            (local_168 - (dVar21 - (local_1b8 + dVar21)))) - local_210) + dVar21;
                  iVar11 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar7]];
                  local_1e8 = dVar22;
                  local_1d8 = dVar20;
                  if (local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar7] == -1) {
                    local_158 = (this->model->col_lower_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11] * dVar21;
                    addToMatrix(this,row,iVar11,dVar21);
                    dVar20 = local_1d8 + local_158;
                    dVar22 = (local_1d8 - (dVar20 - local_158)) +
                             (local_158 - (dVar20 - (dVar20 - local_158)));
                  }
                  else {
                    local_158 = (this->model->col_upper_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11] * dVar21;
                    uStack_150 = 0;
                    addToMatrix(this,row,iVar11,-dVar21);
                    dVar20 = local_1d8 - local_158;
                    dVar22 = (local_1d8 - (local_158 + dVar20)) +
                             (-local_158 - (dVar20 - (local_158 + dVar20)));
                  }
                  dVar22 = local_1e8 + dVar22;
                  piVar16 = piVar16 + 1;
                } while (piVar16 != piVar12);
                dVar20 = dVar20 + dVar22;
                lVar14 = 0x68;
              }
              else {
                dVar20 = (this->model->row_lower_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                dVar22 = 0.0;
                piVar16 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar7 = *piVar16;
                  dVar21 = local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar7] - local_1b8;
                  dVar21 = (((local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar7] - (local_1b8 + dVar21)) +
                            (local_168 - (dVar21 - (local_1b8 + dVar21)))) - local_210) + dVar21;
                  val = -dVar21;
                  iVar11 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar7]];
                  local_1e8 = dVar22;
                  local_1d8 = dVar20;
                  if (local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar7] == -1) {
                    local_158 = (this->model->col_lower_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11] * val;
                    addToMatrix(this,row,iVar11,val);
                    dVar20 = local_1d8 + local_158;
                    dVar22 = (local_1d8 - (dVar20 - local_158)) +
                             (local_158 - (dVar20 - (dVar20 - local_158)));
                  }
                  else {
                    local_158 = val * (this->model->col_upper_).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar11];
                    uStack_150 = 0x8000000000000000;
                    addToMatrix(this,row,iVar11,dVar21);
                    dVar20 = local_1d8 - local_158;
                    dVar22 = (local_1d8 - (local_158 + dVar20)) +
                             (-local_158 - (dVar20 - (local_158 + dVar20)));
                  }
                  dVar22 = local_1e8 + dVar22;
                  piVar16 = piVar16 + 1;
                } while (piVar16 != piVar12);
                dVar20 = dVar20 + dVar22;
                lVar14 = 0x50;
              }
              *(double *)(*(long *)((long)&this->model->num_col_ + lVar14) + uVar13 * 8) = dVar20;
              *local_98 = *local_98 +
                          (int)((ulong)((long)local_208.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)local_208.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
              bVar6 = 0;
            }
          }
LAB_0031ee97:
          if ((bVar6 & 3) != 0) goto LAB_0031eeb1;
        }
      }
      uVar13 = uVar13 + 1;
      pHVar4 = this->model;
    } while (uVar13 != (uint)pHVar4->num_row_);
    uVar10 = 0;
  }
LAB_0031eeb1:
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (char *)0x0) {
    operator_delete(local_108.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Result)uVar10;
}

Assistant:

HPresolve::Result HPresolve::strengthenInequalities(
    HighsPostsolveStack& postsolve_stack, HighsInt& num_strengthened) {
  std::vector<int8_t> complementation;
  std::vector<double> reducedcost;
  std::vector<double> upper;
  std::vector<HighsInt> indices;
  std::vector<HighsInt> positions;
  std::vector<HighsInt> stack;
  std::vector<double> coefs;
  std::vector<HighsInt> cover;

  num_strengthened = 0;
  // Check for timeout according to this frequency
  const HighsInt check_time_frequency = 100;

  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowsize[row] <= 1) continue;
    if (model->row_lower_[row] != -kHighsInf &&
        model->row_upper_[row] != kHighsInf)
      continue;

    // do not run on very dense rows as this could get expensive
    HighsInt rowsize_limit =
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);
    if (rowsize[row] > rowsize_limit) continue;

    // printf("strengthening knapsack of %" HIGHSINT_FORMAT " vars\n",
    // rowsize[row]);

    HighsCDouble maxviolation;
    HighsCDouble continuouscontribution = 0.0;
    double scale;

    if (model->row_lower_[row] != -kHighsInf) {
      // ax >= lb, treat as -ax <= -lb --> -ax + lb <= 0
      maxviolation = model->row_lower_[row];
      scale = -1.0;
    } else {
      // ax <= ub --> ax - ub <= 0
      maxviolation = -model->row_upper_[row];
      scale = 1.0;
    }

    complementation.clear();
    reducedcost.clear();
    upper.clear();
    indices.clear();
    positions.clear();
    complementation.reserve(rowsize[row]);
    reducedcost.reserve(rowsize[row]);
    upper.reserve(rowsize[row]);
    indices.reserve(rowsize[row]);
    positions.reserve(rowsize[row]);
    stack.reserve(rowsize[row]);
    stack.push_back(rowroot[row]);

    bool skiprow = false;

    while (!stack.empty()) {
      // pop element from stack
      HighsInt pos = stack.back();
      stack.pop_back();

      // add non-zeros to stack
      if (ARright[pos] != -1) stack.push_back(ARright[pos]);
      if (ARleft[pos] != -1) stack.push_back(ARleft[pos]);

      // get column index
      HighsInt col = Acol[pos];

      // skip row if a column bound is not finite
      skiprow = model->col_lower_[col] == -kHighsInf ||
                model->col_upper_[col] == kHighsInf;
      if (skiprow) break;

      // compute maximum violation
      // scale =  1:  ax <=  ub --> violation =  ax - ub > 0
      // scale = -1: -ax <= -lb --> violation = -ax + lb > 0
      // this means that for scale = 1 we sum up an upper bound on constraint
      // activity, and for scale = -1 we sum up a lower bound on constraint
      // activity.
      int8_t comp;
      double weight = Avalue[pos] * scale;
      double ub = model->col_upper_[col] - model->col_lower_[col];
      if (weight > 0) {
        comp = 1;
        maxviolation += model->col_upper_[col] * weight;
      } else {
        comp = -1;
        maxviolation += model->col_lower_[col] * weight;
        weight = -weight;
      }

      if (ub <= primal_feastol || weight <= primal_feastol) continue;

      if (model->integrality_[col] == HighsVarType::kContinuous) {
        continuouscontribution += weight * ub;
        continue;
      }

      indices.push_back(reducedcost.size());
      positions.push_back(pos);
      reducedcost.push_back(weight);
      complementation.push_back(comp);
      upper.push_back(ub);
    }

    // Check for timeout according to frequency, unless a particularly
    // dense row has just been analysed
    if ((row & check_time_frequency) == 0 || 10 * rowsize[row] > rowsize_limit)
      HPRESOLVE_CHECKED_CALL(checkTimeLimit());

    if (skiprow) {
      stack.clear();
      continue;
    }

    // maxviolation <= 0 implies that the constraint is redundant:
    // scale =  1: upper bound on activity <= model->row_upper_[row]
    // scale = -1: model->row_lower_[row]  <= lower bound on activity
    if (maxviolation <= primal_feastol) {
      HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
      continue;
    }

    const double smallVal =
        std::max(100 * primal_feastol,
                 primal_feastol * static_cast<double>(maxviolation));
    while (true) {
      if (maxviolation - continuouscontribution <= smallVal || indices.empty())
        break;

      pdqsort(indices.begin(), indices.end(), [&](HighsInt i1, HighsInt i2) {
        return std::make_pair(reducedcost[i1], i1) >
               std::make_pair(reducedcost[i2], i2);
      });

      HighsCDouble lambda = maxviolation - continuouscontribution;

      cover.clear();
      cover.reserve(indices.size());

      for (size_t i = indices.size(); i > 0; --i) {
        HighsInt index = indices[i - 1];
        double delta = upper[index] * reducedcost[index];

        if (upper[index] <= 1000.0 && reducedcost[index] > smallVal &&
            lambda - delta <= smallVal)
          cover.push_back(index);
        else
          lambda -= delta;
      }

      if (cover.empty() || lambda <= smallVal) break;

      HighsInt alpos = *std::min_element(
          cover.begin(), cover.end(), [&](HighsInt i1, HighsInt i2) {
            if (reducedcost[i1] <= 1e-3 || reducedcost[i2] <= 1e-3)
              return reducedcost[i1] > reducedcost[i2];
            return reducedcost[i1] < reducedcost[i2];
          });

      double al = reducedcost[alpos];
      coefs.resize(cover.size());
      double coverrhs = std::max(
          std::ceil(static_cast<double>(lambda / al - primal_feastol)), 1.0);
      HighsCDouble slackupper = -coverrhs;

      double step = kHighsInf;
      for (size_t i = 0; i != cover.size(); ++i) {
        coefs[i] = std::ceil(
            std::min(reducedcost[cover[i]], static_cast<double>(lambda)) / al -
            options->small_matrix_value);
        slackupper += upper[cover[i]] * coefs[i];
        step = std::min(step, reducedcost[cover[i]] / coefs[i]);
      }
      step = std::min(step, static_cast<double>(maxviolation / coverrhs));
      maxviolation -= step * coverrhs;

      HighsInt slackind = reducedcost.size();
      reducedcost.push_back(step);
      upper.push_back(static_cast<double>(slackupper));

      for (size_t i = 0; i != cover.size(); ++i)
        reducedcost[cover[i]] -= step * coefs[i];

      indices.erase(std::remove_if(indices.begin(), indices.end(),
                                   [&](HighsInt i) {
                                     return reducedcost[i] <= primal_feastol;
                                   }),
                    indices.end());
      indices.push_back(slackind);
    }

    double threshold = static_cast<double>(maxviolation + primal_feastol);

    indices.erase(std::remove_if(indices.begin(), indices.end(),
                                 [&](HighsInt i) {
                                   return static_cast<size_t>(i) >=
                                              positions.size() ||
                                          std::abs(reducedcost[i]) <= threshold;
                                 }),
                  indices.end());
    if (indices.empty()) continue;

    auto updateNonZeros = [&](HighsInt row, HighsCDouble& rhs,
                              HighsInt direction) {
      for (HighsInt i : indices) {
        assert(Arow[positions[i]] == row);
        double coefdelta =
            direction * static_cast<double>(reducedcost[i] - maxviolation);
        HighsInt col = Acol[positions[i]];

        if (complementation[i] == -1) {
          rhs += coefdelta * model->col_lower_[col];
          addToMatrix(row, col, coefdelta);
        } else {
          rhs -= coefdelta * model->col_upper_[col];
          addToMatrix(row, col, -coefdelta);
        }
      }
    };

    // update / add non-zeros
    if (scale < 0) {
      HighsCDouble lhs = model->row_lower_[row];
      updateNonZeros(row, lhs, HighsInt{-1});
      model->row_lower_[row] = static_cast<double>(lhs);
    } else {
      HighsCDouble rhs = model->row_upper_[row];
      updateNonZeros(row, rhs, HighsInt{1});
      model->row_upper_[row] = static_cast<double>(rhs);
    }

    num_strengthened += indices.size();
  }

  return Result::kOk;
}